

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O3

QString * __thiscall
QRegularExpression::wildcardToRegularExpression
          (QString *__return_storage_ptr__,QRegularExpression *this,QStringView pattern,
          WildcardConversionOptions options)

{
  ArrayOptions *pAVar1;
  long lVar2;
  Data *pDVar3;
  QArrayData *data;
  QStringView expression;
  char16_t *str;
  char16_t *str_00;
  ulong uVar4;
  long lVar5;
  QRegularExpression *pQVar6;
  QChar QVar7;
  QRegularExpression *pQVar8;
  long alloc;
  long in_FS_OFFSET;
  bool bVar9;
  Data *local_58;
  char16_t *pcStackY_50;
  qsizetype in_stack_ffffffffffffffb8;
  storage_type_conflict *in_stack_ffffffffffffffc0;
  
  lVar5 = pattern.m_size;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  pQVar8 = (QRegularExpression *)((long)&this[1].d.d.ptr + 7);
  if (-1 < (long)this) {
    pQVar8 = this;
  }
  alloc = (long)&(this->d).d.ptr + ((long)pQVar8 >> 4);
  if (alloc < 1) {
    alloc = 0;
  }
  QString::reallocData(__return_storage_ptr__,alloc,KeepSize);
  pDVar3 = (__return_storage_ptr__->d).d;
  if ((pDVar3 != (Data *)0x0) && ((pDVar3->super_QArrayData).alloc != 0)) {
    pAVar1 = &(pDVar3->super_QArrayData).flags;
    *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
              super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
               super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
  }
  bVar9 = ((undefined1  [16])pattern & (undefined1  [16])0x2) == (undefined1  [16])0x0;
  str = L".*";
  if (bVar9) {
    str = L"[^/]*";
  }
  str_00 = L".";
  if (bVar9) {
    str_00 = L"[^/]";
  }
  QString::append(__return_storage_ptr__,(QChar *)L"(?s:",4);
  if (0 < (long)this) {
    pQVar8 = (QRegularExpression *)0x0;
    do {
      pQVar6 = (QRegularExpression *)((long)&(pQVar8->d).d.ptr + 1);
      QVar7.ucs = *(char16_t *)(lVar5 + (long)pQVar8 * 2);
      if ((ushort)QVar7.ucs < 0x2b) {
        if (((ushort)QVar7.ucs - 0x28 < 2) || (QVar7.ucs == L'$')) goto LAB_003f05a6;
        if ((ushort)QVar7.ucs == 0x2a) {
          QString::append(__return_storage_ptr__,(QChar *)str,(ulong)bVar9 * 3 + 2);
          if ((long)pQVar6 < (long)this) {
            while (*(short *)(lVar5 + (long)pQVar6 * 2) == 0x2a) {
              pQVar6 = (QRegularExpression *)((long)&(pQVar6->d).d.ptr + 1);
              if (this == pQVar6) goto LAB_003f05e0;
            }
          }
          goto LAB_003f05be;
        }
LAB_003f05b3:
        QString::append(__return_storage_ptr__,QVar7);
      }
      else {
        uVar4 = (ulong)((ushort)QVar7.ucs - 0x2b);
        if (0x33 < (ushort)QVar7.ucs - 0x2b) {
LAB_003f059e:
          if (2 < (ushort)QVar7.ucs - 0x7b) goto LAB_003f05b3;
LAB_003f05a6:
          QString::append(__return_storage_ptr__,(QChar)0x5c);
          goto LAB_003f05b3;
        }
        if ((0xa000000000009U >> (uVar4 & 0x3f) & 1) != 0) goto LAB_003f05a6;
        if (uVar4 == 0x14) {
          QString::append(__return_storage_ptr__,(QChar *)str_00,(ulong)bVar9 * 3 + 1);
        }
        else {
          if (uVar4 != 0x30) goto LAB_003f059e;
          QString::append(__return_storage_ptr__,(QChar)0x5b);
          if ((long)pQVar6 < (long)this) {
            if (*(short *)(lVar5 + 2 + (long)pQVar8 * 2) == 0x21) {
              QString::append(__return_storage_ptr__,(QChar)0x5e);
              pQVar6 = (QRegularExpression *)((long)&(pQVar8->d).d.ptr + 2);
            }
            if (((long)pQVar6 < (long)this) && (*(short *)(lVar5 + (long)pQVar6 * 2) == 0x5d)) {
              QString::append(__return_storage_ptr__,(QChar)0x5d);
              pQVar6 = (QRegularExpression *)((long)&(pQVar6->d).d.ptr + 1);
            }
            for (; ((long)pQVar6 < (long)this &&
                   (QVar7.ucs = *(char16_t *)(lVar5 + (long)pQVar6 * 2), QVar7.ucs != L']'));
                pQVar6 = (QRegularExpression *)((long)&(pQVar6->d).d.ptr + 1)) {
              if (((undefined1  [16])pattern & (undefined1  [16])0x2) == (undefined1  [16])0x0) {
                if (QVar7.ucs == L'\\') {
LAB_003f0544:
                  QString::append(__return_storage_ptr__,(QChar)0x5c);
                  QVar7.ucs = *(char16_t *)(lVar5 + (long)pQVar6 * 2);
                }
                else if (QVar7.ucs == L'/') goto LAB_003f0656;
              }
              else if (QVar7.ucs == L'\\') goto LAB_003f0544;
              QString::append(__return_storage_ptr__,QVar7);
            }
          }
        }
      }
LAB_003f05be:
      pQVar8 = pQVar6;
    } while ((long)pQVar6 < (long)this);
  }
LAB_003f05e0:
  QString::append(__return_storage_ptr__,(QChar *)0x4c8022,1);
  if (((undefined1  [16])pattern & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    expression.m_data = in_stack_ffffffffffffffc0;
    expression.m_size = in_stack_ffffffffffffffb8;
    anchoredPattern(expression);
    data = &((__return_storage_ptr__->d).d)->super_QArrayData;
    (__return_storage_ptr__->d).d = local_58;
    (__return_storage_ptr__->d).ptr = pcStackY_50;
    (__return_storage_ptr__->d).size = in_stack_ffffffffffffffb8;
    if (data != (QArrayData *)0x0) {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data,2,0x10);
      }
    }
  }
LAB_003f0656:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString QRegularExpression::wildcardToRegularExpression(QStringView pattern, WildcardConversionOptions options)
{
    const qsizetype wclen = pattern.size();
    QString rx;
    rx.reserve(wclen + wclen / 16);
    qsizetype i = 0;
    const QChar *wc = pattern.data();

    struct GlobSettings {
        char16_t nativePathSeparator;
        QStringView starEscape;
        QStringView questionMarkEscape;
    };

    const GlobSettings settings = [options]() {
        if (options.testFlag(NonPathWildcardConversion)) {
            return GlobSettings{ u'\0', u".*", u"." };
        } else {
#ifdef Q_OS_WIN
            return GlobSettings{ u'\\', u"[^/\\\\]*", u"[^/\\\\]" };
#else
            return GlobSettings{ u'/', u"[^/]*", u"[^/]" };
#endif
        }
    }();

    // We want a dot to match everything (incl. newlines), so enable /s mode,
    // limited to the pattern string we're producing.
    rx += u"(?s:";

    while (i < wclen) {
        const QChar c = wc[i++];
        switch (c.unicode()) {
        case '*':
            rx += settings.starEscape;
            // Coalesce sequences of *
            while (i < wclen && wc[i] == u'*')
                ++i;
            break;
        case '?':
            rx += settings.questionMarkEscape;
            break;
        // When not using filepath globbing: \ is escaped, / is itself
        // When using filepath globbing:
        // * Unix: \ gets escaped. / is itself
        // * Windows: \ and / can match each other -- they become [/\\] in regexp
        case '\\':
#ifdef Q_OS_WIN
            if (options.testFlag(NonPathWildcardConversion))
                rx += u"\\\\";
            else
                rx += u"[/\\\\]";
            break;
        case '/':
            if (options.testFlag(NonPathWildcardConversion))
                rx += u'/';
            else
                rx += u"[/\\\\]";
            break;
#endif
        case '$':
        case '(':
        case ')':
        case '+':
        case '.':
        case '^':
        case '{':
        case '|':
        case '}':
            rx += u'\\';
            rx += c;
            break;
        case '[':
            rx += c;
            // Support for the [!abc] or [!a-c] syntax
            if (i < wclen) {
                if (wc[i] == u'!') {
                    rx += u'^';
                    ++i;
                }

                if (i < wclen && wc[i] == u']')
                    rx += wc[i++];

                while (i < wclen && wc[i] != u']') {
                    if (!options.testFlag(NonPathWildcardConversion)) {
                        // The '/' appearing in a character class invalidates the
                        // regular expression parsing. It also concerns '\\' on
                        // Windows OS types.
                        if (wc[i] == u'/' || wc[i] == settings.nativePathSeparator)
                            return rx;
                    }
                    if (wc[i] == u'\\')
                        rx += u'\\';
                    rx += wc[i++];
                }
            }
            break;
        default:
            rx += c;
            break;
        }
    }

    // Closes the (?s: group opened above
    rx += u")";

    if (!(options & UnanchoredWildcardConversion))
        rx = anchoredPattern(rx);

    return rx;
}